

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void random_fill<boost::poly_collection::base_collection<A,std::allocator<A>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_int_distribution<int>,std::uniform_real_distribution<double>>
               (base_collection<A,_std::allocator<A>_> *container,
               mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
               *gen,uniform_int_distribution<int> *rnd_type,uniform_real_distribution<double> *rnd,
               size_t count)

{
  result_type rVar1;
  
  if (count != 0) {
    do {
      rVar1 = std::uniform_int_distribution<int>::operator()(rnd_type,gen,&rnd_type->_M_param);
      switch(rVar1) {
      case 0:
        insert_rnd_value_of<A,boost::poly_collection::base_collection<A,std::allocator<A>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_real_distribution<double>>
                  (container,gen,rnd);
        break;
      case 1:
        insert_rnd_value_of<B,boost::poly_collection::base_collection<A,std::allocator<A>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_real_distribution<double>>
                  (container,gen,rnd);
        break;
      case 2:
        insert_rnd_value_of<C,boost::poly_collection::base_collection<A,std::allocator<A>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_real_distribution<double>>
                  (container,gen,rnd);
        break;
      case 3:
        insert_rnd_value_of<D,boost::poly_collection::base_collection<A,std::allocator<A>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_real_distribution<double>>
                  (container,gen,rnd);
        break;
      case 4:
        insert_rnd_value_of<CA,boost::poly_collection::base_collection<A,std::allocator<A>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_real_distribution<double>>
                  (container,gen,rnd);
        break;
      case 5:
        insert_rnd_value_of<CB,boost::poly_collection::base_collection<A,std::allocator<A>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_real_distribution<double>>
                  (container,gen,rnd);
      }
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void random_fill(Cont&container, E& gen, R1& rnd_type, R2& rnd, std::size_t count )
{
	for ( std::size_t i = 0; i != count; i++)
        {
            switch (rnd_type(gen))
		{
                        case 0: insert_rnd_value_of<A> (container, gen, rnd); break;
                        case 1: insert_rnd_value_of<B> (container, gen, rnd); break;
                        case 2: insert_rnd_value_of<C> (container, gen, rnd); break;
                        case 3: insert_rnd_value_of<D> (container, gen, rnd); break;
			case 4: insert_rnd_value_of<CA>(container, gen, rnd); break;
			case 5: insert_rnd_value_of<CB>(container, gen, rnd); break;
		}
	}
}